

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_MeshCurvatureStats::Set
          (ON_MeshCurvatureStats *this,curvature_style kappa_style,int Kcount,ON_SurfaceCurvature *K
          ,ON_3fVector *N,double infinity)

{
  double *pdVar1;
  int iVar2;
  double *a;
  double dVar3;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  bool local_69;
  int local_68;
  int i;
  double *kappa;
  double k;
  ON_Workspace ws;
  bool rc;
  double infinity_local;
  ON_3fVector *N_local;
  ON_SurfaceCurvature *K_local;
  int Kcount_local;
  curvature_style kappa_style_local;
  ON_MeshCurvatureStats *this_local;
  
  local_69 = 0 < Kcount && K != (ON_SurfaceCurvature *)0x0;
  ws.m_pMemBlk._7_1_ = local_69;
  Destroy(this);
  if ((ws.m_pMemBlk._7_1_ & 1) != 0) {
    ON_Workspace::ON_Workspace((ON_Workspace *)&k);
    a = ON_Workspace::GetDoubleMemory((ON_Workspace *)&k,(long)Kcount);
    switch(kappa_style) {
    case gaussian_curvature:
      this->m_style = kappa_style;
      local_98 = infinity;
      if (infinity <= 0.0) {
        local_98 = 1e+20;
      }
      this->m_infinity = local_98;
      break;
    case mean_curvature:
      this->m_style = kappa_style;
      local_a0 = infinity;
      if (infinity <= 0.0) {
        local_a0 = 10000000000.0;
      }
      this->m_infinity = local_a0;
      break;
    case min_curvature:
      this->m_style = kappa_style;
      local_a8 = infinity;
      if (infinity <= 0.0) {
        local_a8 = 10000000000.0;
      }
      this->m_infinity = local_a8;
      break;
    case max_curvature:
      this->m_style = kappa_style;
      local_b0 = infinity;
      if (infinity <= 0.0) {
        local_b0 = 10000000000.0;
      }
      this->m_infinity = local_b0;
      break;
    default:
      ws.m_pMemBlk._7_1_ = 0;
    }
    for (local_68 = 0; local_68 < Kcount; local_68 = local_68 + 1) {
      switch(kappa_style) {
      case gaussian_curvature:
        kappa = (double *)ON_SurfaceCurvature::GaussianCurvature(K + local_68);
        break;
      case mean_curvature:
        dVar3 = ON_SurfaceCurvature::MeanCurvature(K + local_68);
        kappa = (double *)((ulong)dVar3 & 0x7fffffffffffffff);
        break;
      case min_curvature:
        dVar3 = ON_SurfaceCurvature::MinimumRadius(K + local_68);
        kappa = (double *)((ulong)dVar3 & 0x7fffffffffffffff);
        break;
      case max_curvature:
        dVar3 = ON_SurfaceCurvature::MaximumRadius(K + local_68);
        kappa = (double *)((ulong)dVar3 & 0x7fffffffffffffff);
        break;
      default:
        kappa = (double *)0x0;
      }
      if (ABS((double)kappa) < this->m_infinity) {
        if (this->m_count == 0) {
          (this->m_range).m_t[1] = (double)kappa;
          (this->m_range).m_t[0] = (double)kappa;
        }
        else if ((this->m_range).m_t[0] <= (double)kappa) {
          pdVar1 = (this->m_range).m_t + 1;
          if (*pdVar1 <= (double)kappa && (double)kappa != *pdVar1) {
            (this->m_range).m_t[1] = (double)kappa;
          }
        }
        else {
          (this->m_range).m_t[0] = (double)kappa;
        }
        iVar2 = this->m_count;
        this->m_count = iVar2 + 1;
        a[iVar2] = (double)kappa;
      }
      else {
        this->m_count_infinite = this->m_count_infinite + 1;
      }
    }
    if (this->m_count == 0) {
      ws.m_pMemBlk._7_1_ = 0;
    }
    else {
      ON_SortDoubleArray(quick_sort,a,(long)this->m_count);
      this->m_mode = a[this->m_count / 2];
      if (this->m_count % 2 == 0) {
        this->m_mode = a[this->m_count / 2 + -1] + this->m_mode;
        this->m_mode = this->m_mode * 0.5;
      }
      for (local_68 = 0; local_68 < this->m_count; local_68 = local_68 + 1) {
        this->m_average = a[local_68] + this->m_average;
      }
      this->m_average = this->m_average / (double)this->m_count;
      for (local_68 = 0; local_68 < this->m_count; local_68 = local_68 + 1) {
        this->m_adev = ABS(a[local_68] - this->m_average) + this->m_adev;
      }
      this->m_adev = this->m_adev / (double)this->m_count;
    }
    ON_Workspace::~ON_Workspace((ON_Workspace *)&k);
  }
  return (bool)(ws.m_pMemBlk._7_1_ & 1);
}

Assistant:

bool ON_MeshCurvatureStats::Set( ON::curvature_style kappa_style,
                                 int Kcount,
                                 const ON_SurfaceCurvature* K,
                                 const ON_3fVector* N, // needed for normal sectional curvatures
                                 double infinity
                                 )
{
  bool rc = (Kcount > 0 && K != nullptr);

  Destroy();

  if (rc) {
    ON_Workspace ws;
    //ON_3dVector tangent;
    double k;
    double* kappa = ws.GetDoubleMemory(Kcount);
    int i;

    switch( kappa_style ) {
    case ON::gaussian_curvature:
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e20;
      break;
    case ON::mean_curvature: // unsigned mean
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
      break;
    case ON::min_curvature: // minimum unsigned radius of curvature
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
      break;
    case ON::max_curvature: // maximum unsigned radius of curvature
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
      break;
    //case ON::section_curvature_x:
    //  if ( !N )
    //    kappa_style = ON::unknown_curvature_style;
    //  m_style = kappa_style;
    //  m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
    //  break;
    //case ON::section_curvature_y:
    //  if ( !N )
    //    kappa_style = ON::unknown_curvature_style;
    //  m_style = kappa_style;
    //  m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
    //  break;
    //case ON::section_curvature_z:
    //  if ( !N )
    //    kappa_style = ON::unknown_curvature_style;
    //  m_style = kappa_style;
    //  m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
    //  break;
    default:
      rc = false;
      break;
    }

    for ( i = 0; i < Kcount; i++ ) {
      switch( kappa_style ) {
      case ON::gaussian_curvature:
        k = K[i].GaussianCurvature();
        break;
      case ON::mean_curvature: // unsigned mean
        k = fabs(K[i].MeanCurvature());
        break;
      case ON::min_curvature: // minimum unsigned radius of curvature
        k = fabs(K[i].MinimumRadius());
        break;
      case ON::max_curvature: // maximum unsigned radius of curvature
        k = fabs(K[i].MaximumRadius());
        break;
      //case ON::section_curvature_x:
      //  tangent.x = 0.0; tangent.y = -N[i].z; tangent.z = N[i].y;
      //  if ( fabs(tangent.y) <= ON_SQRT_EPSILON && fabs(tangent.z) <= ON_SQRT_EPSILON )
      //    tangent.Zero();
      //  else
      //    tangent.Unitize();
      //  k = fabs(K[i].NormalCurvature(tangent));
      //  break;
      //case ON::section_curvature_y:
      //  tangent.x = N[i].z; tangent.y = 0.0; tangent.z = -N[i].x;
      //  if ( fabs(tangent.x) <= ON_SQRT_EPSILON && fabs(tangent.z) <= ON_SQRT_EPSILON )
      //    tangent.Zero();
      //  else
      //    tangent.Unitize();
      //  k = fabs(K[i].NormalCurvature(tangent));
      //  break;
      //case ON::section_curvature_z:
      //  tangent.x = -N[i].y; tangent.y = N[i].x; tangent.z = 0.0;
      //  if ( fabs(tangent.x) <= ON_SQRT_EPSILON && fabs(tangent.y) <= ON_SQRT_EPSILON )
      //    tangent.Zero();
      //  else
      //    tangent.Unitize();
      //  k = fabs(K[i].NormalCurvature(tangent));
      //  break;
      default:
        k=0.0;
        break;
      }
      if ( fabs(k) >= m_infinity ) {
        m_count_infinite++;
        continue;
      }
      if ( m_count ) {
        if ( k < m_range.m_t[0] )
          m_range.m_t[0] = k;
        else if ( k > m_range.m_t[1] )
          m_range.m_t[1] = k;
      }
      else {
        m_range.m_t[0] = m_range.m_t[1] = k;
      }
      kappa[m_count++] = k;
    }


    if ( m_count == 0 )
      rc = false;
    else {
      // sum curvatures
      ON_SortDoubleArray( ON::sort_algorithm::quick_sort, kappa, m_count );

      // mode
      m_mode = kappa[m_count/2];
      if ( 0 == (m_count % 2) ) {
        m_mode += kappa[(m_count/2)-1];
        m_mode *= 0.5;
      }

      // average
      for ( i = 0; i < m_count; i++ ) {
        m_average += kappa[i];
      }
      m_average = m_average/m_count;
      
      // average deviation
      for ( i = 0; i < m_count; i++ ) {
        m_adev += fabs(kappa[i] - m_average);
      }
      m_adev = m_adev/m_count;
    }  
  }
  
  return rc;  
}